

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC,VmConstant *argument)

{
  int iVar1;
  undefined4 extraout_var;
  ExpressionContext *ctx_00;
  
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
  ctx_00 = (ExpressionContext *)ctx->allocator;
  RegVmLoweredInstruction::RegVmLoweredInstruction
            ((RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar1),(Allocator *)ctx_00,location,
             code,rA,rB,rC,argument);
  AddInstruction(this,ctx_00,(RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC, VmConstant *argument)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, argument));
}